

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O2

string * __thiscall Customer::getEmail_abi_cxx11_(string *__return_storage_ptr__,Customer *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->email);
  return __return_storage_ptr__;
}

Assistant:

string Customer::getEmail() const{
	return email;
}